

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O1

void __thiscall
gmath::EquidistantDistortion::EquidistantDistortion
          (EquidistantDistortion *this,Properties *prop,int id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_ECX;
  int iVar2;
  undefined4 in_register_00000014;
  string local_40;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00178b28;
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->ed,"0");
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e2",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->ed + 1,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e3",(char *)(ulong)(uint)id,iVar2);
  iVar2 = 0x163970;
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->ed + 2,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"e4",(char *)(ulong)(uint)id,iVar2);
  gutil::Properties::getValue<double>(prop,local_40._M_dataplus._M_p,this->ed + 3,"0");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

EquidistantDistortion::EquidistantDistortion(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("e1", id).c_str(), ed[0], "0");
  prop.getValue(getCameraKey("e2", id).c_str(), ed[1], "0");
  prop.getValue(getCameraKey("e3", id).c_str(), ed[2], "0");
  prop.getValue(getCameraKey("e4", id).c_str(), ed[3], "0");
}